

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O3

void __thiscall
qclab::qgates::CPhase<std::complex<float>_>::CPhase
          (CPhase<std::complex<float>_> *this,int control,int target,real_type theta,
          int controlState)

{
  Phase<std::complex<float>_> *this_00;
  char *__assertion;
  
  QControlledGate2<std::complex<float>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<float>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004ef260;
  this_00 = (Phase<std::complex<float>_> *)operator_new(0x18);
  Phase<std::complex<float>_>::Phase(this_00,target,theta,false);
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::Phase<std::complex<float>_>,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_false>._M_head_impl = this_00
  ;
  if (control < 0) {
    __assertion = "control >= 0";
  }
  else {
    if (-1 < target) {
      if (target != control) {
        return;
      }
      __assert_fail("control != target",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CPhase.hpp"
                    ,0x41,
                    "qclab::qgates::CPhase<std::complex<float>>::CPhase(const int, const int, const real_type, const int) [T = std::complex<float>]"
                   );
    }
    __assertion = "target >= 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CPhase.hpp"
                ,0x40,
                "qclab::qgates::CPhase<std::complex<float>>::CPhase(const int, const int, const real_type, const int) [T = std::complex<float>]"
               );
}

Assistant:

CPhase( const int control , const int target , const real_type theta ,
                const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< Phase< T > >( target , theta ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }